

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O3

void __thiscall
Importer_resolveWithMissingItems_Test::~Importer_resolveWithMissingItems_Test
          (Importer_resolveWithMissingItems_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Importer, resolveWithMissingItems)
{
    std::vector<std::string> e = {
        "Import of units 'i_dont_exist' from '" + resourcePath("importer/") + "units_source.cellml' requires units named 'i_dont_exist' which cannot be found.",
        "Import of component 'i_dont_exist' from '" + resourcePath("importer/") + "components_source.cellml' requires component named 'i_dont_exist' which cannot be found.",
    };
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("importer/importing_nonexistent_items.cellml"));
    EXPECT_EQ(size_t(0), parser->issueCount());

    auto importer = libcellml::Importer::create();
    importer->resolveImports(model, resourcePath("importer/"));
    EXPECT_EQ(size_t(2), importer->issueCount());
    EXPECT_EQ_ISSUES(e, importer);
}